

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fSyncTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles3::Functional::FenceSyncCase::iterate(FenceSyncCase *this)

{
  CallLogWrapper *this_00;
  Random *rnd;
  ostringstream *poVar1;
  TestLog *log;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  GLenum GVar5;
  uint uVar6;
  GLenum err;
  int iVar7;
  ulong uVar8;
  GLsync p_Var9;
  TestError *this_01;
  IterateResult IVar10;
  ulong uVar11;
  char *pcVar12;
  float fVar13;
  vector<float,_std::allocator<float>_> vertices;
  int local_234;
  ScopedLogSection section;
  string local_210;
  string local_1f0;
  string header;
  MessageBuilder local_1b0;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_234 = this->m_iterNdx + 1;
  de::toString<int>(&local_1f0,&local_234);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                 "Case iteration ",&local_1f0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section," / "
                );
  de::toString<int>(&local_210,&NUM_CASE_ITERATIONS);
  std::operator+(&header,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1b0,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)&local_1f0);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,&header,&header);
  this_00 = &this->super_CallLogWrapper;
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glUseProgram(this_00,(this->m_program->m_program).m_program);
  glu::CallLogWrapper::glEnable(this_00,0xb71);
  glu::CallLogWrapper::glClearColor(this_00,0.3,0.3,0.3,1.0);
  glu::CallLogWrapper::glClearDepthf(this_00,1.0);
  glu::CallLogWrapper::glClear(this_00,0x4100);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
  iVar7 = *(int *)&(this->super_CallLogWrapper).field_0x14;
  std::vector<float,_std::allocator<float>_>::resize(&vertices,(long)(iVar7 * 0xc));
  uVar6 = iVar7 * 3;
  uVar11 = 0;
  uVar8 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar8 = uVar11;
  }
  rnd = &this->m_rnd;
  for (; uVar8 * 4 != uVar11; uVar11 = uVar11 + 4) {
    fVar13 = deRandom_getFloat(&rnd->m_rnd);
    iVar7 = (int)uVar11;
    vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar7] = fVar13 + fVar13 + -1.0;
    fVar13 = deRandom_getFloat(&rnd->m_rnd);
    vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar7 + 1] = fVar13 + fVar13 + -1.0;
    fVar13 = deRandom_getFloat(&rnd->m_rnd);
    vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar7 + 2] = fVar13 + 0.0;
    vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar7 + 3] = 1.0;
  }
  glu::CallLogWrapper::glVertexAttribPointer
            (this_00,0,4,0x1406,'\0',0,
             vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  uVar8 = (ulong)((long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  glu::CallLogWrapper::glDrawArrays
            (this_00,4,0,
             (GLsizei)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) / 4));
  poVar1 = &local_1b0.m_str;
  local_1b0.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"// Primitives drawn.");
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  p_Var9 = glu::CallLogWrapper::glFenceSync(this_00,0x9117,0);
  this->m_syncObject = p_Var9;
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"Sync object created",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fSyncTests.cpp"
                  ,0xcb);
  poVar1 = &local_1b0.m_str;
  local_1b0.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"// Sync object created.");
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  uVar6 = this->m_caseOptions;
  if ((uVar6 & 1) != 0) {
    glu::CallLogWrapper::glFlush(this_00);
    uVar6 = this->m_caseOptions;
  }
  if ((uVar6 & 2) != 0) {
    glu::CallLogWrapper::glFinish(this_00);
  }
  uVar6 = this->m_waitCommand;
  if ((uVar6 & 1) != 0) {
    glu::CallLogWrapper::glWaitSync(this_00,this->m_syncObject,this->m_waitFlags,this->m_timeout);
    GVar5 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar5,"glWaitSync called",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fSyncTests.cpp"
                    ,0xdc);
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"// Wait command glWaitSync called with GL_TIMEOUT_IGNORED.");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    uVar6 = this->m_waitCommand;
  }
  bVar2 = 1;
  bVar4 = 1;
  if ((uVar6 & 2) != 0) {
    GVar5 = glu::CallLogWrapper::glClientWaitSync
                      (this_00,this->m_syncObject,this->m_waitFlags,this->m_timeout);
    err = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(err,"glClientWaitSync called",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fSyncTests.cpp"
                    ,0xe2);
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"// glClientWaitSync return value:");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    switch(GVar5) {
    case 0x911a:
      poVar1 = &local_1b0.m_str;
      local_1b0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"// GL_ALREADY_SIGNALED");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      bVar4 = 0;
      goto LAB_00566e00;
    case 0x911b:
      local_1b0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
      std::operator<<((ostream *)&local_1b0.m_str,"// GL_TIMEOUT_EXPIRED");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      break;
    case 0x911c:
      local_1b0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
      std::operator<<((ostream *)&local_1b0.m_str,"// GL_CONDITION_SATISFIED");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      break;
    case 0x911d:
      poVar1 = &local_1b0.m_str;
      local_1b0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"// GL_WAIT_FAILED");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      bVar3 = false;
      goto LAB_00566e03;
    default:
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"// Illegal return value!",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fSyncTests.cpp"
                 ,0xea);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
  }
LAB_00566e00:
  bVar2 = bVar4;
  bVar3 = true;
LAB_00566e03:
  glu::CallLogWrapper::glFinish(this_00);
  if (!(bool)(bVar2 ^ 1 | (this->m_caseOptions & 2) == 0)) {
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"// Expected glClientWaitSync to return GL_ALREADY_SIGNALED.")
    ;
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    bVar3 = false;
  }
  if (this->m_syncObject != (GLsync)0x0) {
    glu::CallLogWrapper::glDeleteSync(this_00,this->m_syncObject);
    this->m_syncObject = (GLsync)0x0;
    GVar5 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar5,"Sync object deleted",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fSyncTests.cpp"
                    ,0xfc);
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"// Sync object deleted.");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  poVar1 = &local_1b0.m_str;
  local_1b0.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"// Test result: ");
  pcVar12 = "Failed!";
  if (bVar3) {
    pcVar12 = "Passed!";
  }
  std::operator<<((ostream *)poVar1,pcVar12);
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  if (bVar3) {
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"// Sync objects created and deleted successfully.");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    iVar7 = this->m_iterNdx + 1;
    this->m_iterNdx = iVar7;
    IVar10 = (IterateResult)(iVar7 < 5);
  }
  else {
    IVar10 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::__cxx11::string::~string((string *)&header);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&vertices.super__Vector_base<float,_std::allocator<float>_>);
  return IVar10;
}

Assistant:

FenceSyncCase::IterateResult FenceSyncCase::iterate (void)
{
	TestLog&					log			= m_testCtx.getLog();
	std::vector<float>			vertices;
	bool						testOk		= true;

	std::string					header		= "Case iteration " + de::toString(m_iterNdx+1) + " / " + de::toString(NUM_CASE_ITERATIONS);
	const tcu::ScopedLogSection	section		(log, header, header);

	enableLogging(true);

	DE_ASSERT		(m_program);
	glUseProgram	(m_program->getProgram());
	glEnable		(GL_DEPTH_TEST);
	glClearColor	(0.3f, 0.3f, 0.3f, 1.0f);
	glClearDepthf	(1.0f);
	glClear			(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

	// Generate vertices

	glEnableVertexAttribArray (0);
	generateVertices		  (vertices, m_numPrimitives, m_rnd);
	glVertexAttribPointer	  (0, 4, GL_FLOAT, GL_FALSE, 0, &vertices[0]);

	// Draw

	glDrawArrays(GL_TRIANGLES, 0, (int)vertices.size() / 4);
	log << TestLog::Message << "// Primitives drawn." << TestLog::EndMessage;

	// Create sync object

	m_syncObject = glFenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLU_CHECK_MSG ("Sync object created");
	log << TestLog::Message << "// Sync object created." << TestLog::EndMessage;

	if (m_caseOptions & CASE_FLUSH_BEFORE_WAIT)
		glFlush();
	if (m_caseOptions & CASE_FINISH_BEFORE_WAIT)
		glFinish();

	// Wait for sync object

	GLenum waitValue = 0;

	if (m_waitCommand & COMMAND_WAIT_SYNC)
	{
		DE_ASSERT(m_timeout == GL_TIMEOUT_IGNORED);
		DE_ASSERT(m_waitFlags == 0);
		glWaitSync(m_syncObject, m_waitFlags, m_timeout);
		GLU_CHECK_MSG ("glWaitSync called");
		log << TestLog::Message << "// Wait command glWaitSync called with GL_TIMEOUT_IGNORED." << TestLog::EndMessage;
	}
	if (m_waitCommand & COMMAND_CLIENT_WAIT_SYNC)
	{
		waitValue = glClientWaitSync(m_syncObject, m_waitFlags, m_timeout);
		GLU_CHECK_MSG ("glClientWaitSync called");
		log << TestLog::Message << "// glClientWaitSync return value:" << TestLog::EndMessage;
		switch (waitValue)
		{
			case GL_ALREADY_SIGNALED:	 log << TestLog::Message << "// GL_ALREADY_SIGNALED"	<< TestLog::EndMessage; break;
			case GL_TIMEOUT_EXPIRED:	 log << TestLog::Message << "// GL_TIMEOUT_EXPIRED"		<< TestLog::EndMessage; break;
			case GL_CONDITION_SATISFIED: log << TestLog::Message << "// GL_CONDITION_SATISFIED"	<< TestLog::EndMessage; break;
			case GL_WAIT_FAILED:		 log << TestLog::Message << "// GL_WAIT_FAILED"			<< TestLog::EndMessage; testOk = false; break;
			default:					 TCU_FAIL("// Illegal return value!");
		}
	}

	glFinish();

	if (m_caseOptions & CASE_FINISH_BEFORE_WAIT && waitValue != GL_ALREADY_SIGNALED)
	{
		testOk = false;
		log << TestLog::Message << "// Expected glClientWaitSync to return GL_ALREADY_SIGNALED." << TestLog::EndMessage;
	}

	// Delete sync object

	if (m_syncObject)
	{
		glDeleteSync(m_syncObject);
		m_syncObject = DE_NULL;
		GLU_CHECK_MSG ("Sync object deleted");
		log << TestLog::Message << "// Sync object deleted." << TestLog::EndMessage;
	}

	// Evaluate test result

	log << TestLog::Message << "// Test result: " << (testOk ? "Passed!" : "Failed!") << TestLog::EndMessage;

	if (!testOk)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	log << TestLog::Message << "// Sync objects created and deleted successfully." << TestLog::EndMessage;

	return (++m_iterNdx < NUM_CASE_ITERATIONS) ? CONTINUE : STOP;
}